

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O0

void __thiscall
OpenMD::RNEMD::SPFMethod::isValidExchange
          (SPFMethod *this,Vector3d *v_a,Vector3d *v_b,RealType *a,RealType *b)

{
  double dVar1;
  double dVar2;
  double *in_RCX;
  long in_RDI;
  double *in_R8;
  RealType RVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  RealType b2;
  RealType a2_1;
  RealType bDenominator;
  RealType bNumerator;
  RealType aDenominator;
  RealType aNumerator;
  RealType a2;
  RealType denominator;
  RealType numerator;
  SelectionManager *in_stack_00000080;
  SPFMethod *in_stack_00000088;
  RealType deltaU;
  Vector3d *P_b;
  Vector3d *P_a;
  Vector<double,_3U> *in_stack_fffffffffffffed0;
  double dVar10;
  Vector<double,_3U> *in_stack_fffffffffffffed8;
  SPFForceManager *in_stack_ffffffffffffff28;
  undefined1 local_88 [40];
  undefined1 *local_60;
  undefined1 local_58 [40];
  undefined1 *local_30;
  double *local_28;
  double *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  calculateSlabTherodynamicQuantities(in_stack_00000088,in_stack_00000080);
  local_30 = local_58;
  calculateSlabTherodynamicQuantities(in_stack_00000088,in_stack_00000080);
  local_60 = local_88;
  RVar3 = SPFForceManager::getScaledDeltaU(in_stack_ffffffffffffff28);
  dVar4 = RVar3 * 0.0004184;
  if ((0.0 < *(double *)(local_30 + 0x18)) && (0.0 < *(double *)(local_60 + 0x18))) {
    operator/(in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    operator/(in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    if ((*(byte *)(in_RDI + 0x28f0) & 1) == 0) {
      dVar9 = *(double *)(in_RDI + 0x2a8);
      dVar1 = *(double *)(local_30 + 0x20);
      dVar10 = *(double *)(local_30 + 0x18);
      dVar7 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x34dc55);
      dVar2 = *(double *)(in_RDI + 0x2a8);
      dVar5 = *(double *)(local_60 + 0x20);
      dVar6 = *(double *)(local_60 + 0x18);
      dVar8 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x34dce0);
      dVar9 = (dVar4 - dVar9) / (-dVar10 * dVar7 + dVar1 * 2.0) + 1.0;
      dVar4 = (dVar4 + dVar2) / (-dVar6 * dVar8 + dVar5 * 2.0) + 1.0;
      if ((0.0 < dVar9) && (0.0 < dVar4)) {
        dVar9 = sqrt(dVar9);
        *local_20 = dVar9;
        dVar4 = sqrt(dVar4);
        *local_28 = dVar4;
      }
    }
    else {
      dVar9 = *(double *)(local_30 + 0x20);
      dVar1 = *(double *)(local_60 + 0x20);
      dVar10 = *(double *)(local_30 + 0x18);
      dVar5 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x34db0d);
      dVar2 = *(double *)(local_60 + 0x18);
      dVar6 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x34db69);
      dVar4 = dVar4 / (-(dVar2 * 0.5) * dVar6 + -(dVar10 * 0.5) * dVar5 + dVar9 + dVar1) + 1.0;
      if (0.0 < dVar4) {
        dVar4 = sqrt(dVar4);
        *local_20 = dVar4;
        *local_28 = *local_20;
      }
    }
  }
  return;
}

Assistant:

void SPFMethod::isValidExchange(Vector3d& v_a, Vector3d& v_b, RealType& a,
                                  RealType& b) {
    const auto& [P_a, M_a, K_a] = calculateSlabTherodynamicQuantities(smanA_);
    const auto& [P_b, M_b, K_b] = calculateSlabTherodynamicQuantities(smanB_);

    RealType deltaU =
        Constants::energyConvert * forceManager_->getScaledDeltaU();

    if ((M_a > 0.0) && (M_b > 0.0)) {  // both slabs are not empty
      v_a = P_a / M_a;
      v_b = P_b / M_b;

      if (uniformKineticScaling_) {
        RealType numerator   = deltaU;
        RealType denominator = K_a + K_b;
        denominator -= 0.5 * M_a * v_a.lengthSquare();
        denominator -= 0.5 * M_b * v_b.lengthSquare();

        RealType a2 = (numerator / denominator) + 1.0;

        if (a2 > 0.0) {
          a = std::sqrt(a2);
          b = a;
        }
      } else {
        RealType aNumerator   = deltaU - kineticTarget_;
        RealType aDenominator = 2.0 * K_a;
        aDenominator -= M_a * v_a.lengthSquare();

        RealType bNumerator   = deltaU + kineticTarget_;
        RealType bDenominator = 2.0 * K_b;
        bDenominator -= M_b * v_b.lengthSquare();

        RealType a2 = (aNumerator / aDenominator) + 1.0;
        RealType b2 = (bNumerator / bDenominator) + 1.0;

        if (a2 > 0.0 && b2 > 0.0) {
          a = std::sqrt(a2);
          b = std::sqrt(b2);
        }
      }
    }
  }